

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::exists(path *p,error_code *ec)

{
  byte bVar1;
  file_status s;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  file_status local_28;
  file_status in_stack_ffffffffffffffe0;
  file_status in_stack_ffffffffffffffe8;
  
  status((path *)in_stack_ffffffffffffffe8,(error_code *)in_stack_ffffffffffffffe0);
  file_status::file_status
            ((file_status *)&stack0xffffffffffffffe0,(file_status *)&stack0xffffffffffffffe8);
  bVar1 = status_known((file_status *)0x28dc2b);
  file_status::~file_status((file_status *)&stack0xffffffffffffffe0);
  if ((bVar1 & 1) != 0) {
    std::error_code::clear
              ((error_code *)
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  }
  file_status::file_status(&local_28,(file_status *)&stack0xffffffffffffffe8);
  bVar1 = exists((file_status *)in_stack_ffffffffffffffe0);
  file_status::~file_status(&local_28);
  file_status::~file_status((file_status *)&stack0xffffffffffffffe8);
  return (bool)(bVar1 & 1);
}

Assistant:

GHC_INLINE bool exists(const path& p, std::error_code& ec) noexcept
{
    file_status s = status(p, ec);
    if (status_known(s)) {
        ec.clear();
    }
    return exists(s);
}